

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O0

pageAnalyzer * __thiscall
pageAnalyzer::getInfoFromContent
          (pageAnalyzer *this,string *keyToFindTarStr,int offset,int getMode,string *keyToFindPos,
          char endChar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  undefined7 in_register_00000089;
  char in_stack_00000008;
  int i;
  int startPos;
  int pos;
  allocator local_32;
  undefined1 local_31;
  ulong local_30;
  string *keyToFindPos_local;
  int getMode_local;
  int offset_local;
  string *keyToFindTarStr_local;
  pageAnalyzer *this_local;
  string *result;
  
  keyToFindPos_local._0_4_ = (int)keyToFindPos;
  _getMode_local = CONCAT44(in_register_00000014,offset);
  local_30 = CONCAT71(in_register_00000089,endChar);
  local_31 = 0;
  keyToFindPos_local._4_4_ = getMode;
  keyToFindTarStr_local = keyToFindTarStr;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  for (i = 0; sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(keyToFindTarStr + 0x20)), (ulong)(long)i < sVar4; i = i + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(keyToFindTarStr + 0x20),(long)i);
    lVar6 = std::__cxx11::string::find((string *)pvVar5,_getMode_local);
    if (lVar6 != -1) break;
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(keyToFindTarStr + 0x20));
  if ((long)i != sVar4) {
    iVar1 = keyToFindPos_local._4_4_ + i;
    if ((int)keyToFindPos_local == 0x11) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(keyToFindTarStr + 0x20),(long)iVar1);
      std::__cxx11::string::operator=((string *)this,(string *)pvVar5);
    }
    else if ((int)keyToFindPos_local == 0x12) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(keyToFindTarStr + 0x20),(long)iVar1);
      iVar2 = std::__cxx11::string::find((string *)pvVar5,local_30);
      iVar3 = std::__cxx11::string::length();
      lVar6 = std::__cxx11::string::length();
      if ((iVar2 + iVar3) - lVar6 != -1) {
        while( true ) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(keyToFindTarStr + 0x20),(long)iVar1);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
          if (*pcVar7 == in_stack_00000008) break;
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(keyToFindTarStr + 0x20),(long)iVar1);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
          std::__cxx11::string::operator+=((string *)this,*pcVar7);
        }
      }
    }
  }
  return this;
}

Assistant:

std::string pageAnalyzer::getInfoFromContent(const std::string &keyToFindTarStr, int offset, int getMode, const std::string &keyToFindPos, char endChar)
{
    std::string result = std::string("");
    int pos = 0;
    for(; pos < this->pageContent.size(); pos++)
        if(this->pageContent[pos].find(keyToFindTarStr) != std::string::npos) break;
    if(pos == pageContent.size());
    else
    {
        pos += offset;
        if(getMode == GETMODE_ALL) result = this->pageContent[pos];
        else if(getMode == GETMODE_PART)
        {
            int startPos = this->pageContent[pos].find(keyToFindPos) + keyToFindPos.length();
            if(startPos - keyToFindPos.length() == std::string::npos);
            else
                for(int i = startPos; this->pageContent[pos][i] != endChar; i++)
                    result += this->pageContent[pos][i];
        }
    }
    return result;
}